

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

DNA * __thiscall Population::mutation(DNA *__return_storage_ptr__,Population *this,DNA *dna)

{
  _Rb_tree_header *__x;
  _Base_ptr p_Var1;
  size_t sVar2;
  Room *pRVar3;
  Subject *pSVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  string *psVar7;
  _Base_ptr p_Var8;
  double dVar9;
  
  __x = &(dna->schedule).schedule._M_t._M_impl.super__Rb_tree_header;
  for (p_Var6 = (dna->schedule).schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != __x;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    p_Var5 = *(_Rb_tree_node_base **)(p_Var6 + 4);
    if (p_Var5 != (_Rb_tree_node_base *)&p_Var6[3]._M_left) {
      do {
        p_Var1 = p_Var5[2]._M_parent;
        if (*(_Base_ptr *)(p_Var5 + 2) != p_Var1) {
          psVar7 = (string *)&(*(_Base_ptr *)(p_Var5 + 2))[4]._M_left;
          do {
            random_engine();
            dVar9 = std::
                    generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                              (&random_engine::smt);
            if (dVar9 < this->mutationRate_) {
              pRVar3 = Schedule::GetRandomRoom(this->data_->rooms,*(size_t *)(p_Var6 + 3));
              sVar2 = pRVar3->capacity;
              *(undefined8 *)(psVar7 + -0x10) = *(undefined8 *)pRVar3;
              *(size_t *)(psVar7 + -8) = sVar2;
            }
            random_engine();
            dVar9 = std::
                    generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                              (&random_engine::smt);
            if (dVar9 < this->mutationRate_) {
              GetRandom<Teacher>((vector<Teacher,_std::allocator<Teacher>_> *)(psVar7 + -0x28));
              std::__cxx11::string::_M_assign(psVar7);
            }
            random_engine();
            dVar9 = std::
                    generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                              (&random_engine::smt);
            if (dVar9 < this->mutationRate_) {
              pSVar4 = GetRandom<Subject>((vector<Subject,_std::allocator<Subject>_> *)
                                          &p_Var6[2]._M_parent);
              std::__cxx11::string::_M_assign(psVar7 + -0x48);
              std::vector<Teacher,_std::allocator<Teacher>_>::operator=
                        ((vector<Teacher,_std::allocator<Teacher>_> *)(psVar7 + -0x28),
                         &pSVar4->teachers);
              GetRandom<Teacher>((vector<Teacher,_std::allocator<Teacher>_> *)(psVar7 + -0x28));
              std::__cxx11::string::_M_assign(psVar7);
            }
            p_Var8 = (_Base_ptr)(psVar7 + 0x48);
            psVar7 = psVar7 + 0xd8;
          } while (p_Var8 != p_Var1);
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)&p_Var6[3]._M_left);
    }
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->schedule).schedule._M_t._M_impl.super__Rb_tree_header,__x);
  __return_storage_ptr__->fitness = dna->fitness;
  return __return_storage_ptr__;
}

Assistant:

DNA Population::mutation(DNA dna) const {
    auto& schedule = dna.schedule.schedule;
    for (auto&[group, schedulePerGroup] : schedule) {
        for (auto&[day, listOfClasses] : schedulePerGroup) {
            for (Class& class_ : listOfClasses) {
                if (RandomProbability() < mutationRate_) {
                    class_.room = Schedule::GetRandomRoom(data_.rooms, group.size);
                }
                if (RandomProbability() < mutationRate_) {
                    class_.teacher = GetRandom(class_.subject.teachers);
                }
                if (RandomProbability() < mutationRate_) {
                    class_.subject = GetRandom(group.subjects);
                    class_.teacher = GetRandom(class_.subject.teachers);
                }
            }
        }
    }
    return dna;
}